

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O0

UMat * __thiscall
FlickerRemover::removeFlickering(FlickerRemover *this,UMat *frame,double timestamp,string *error)

{
  int iVar1;
  int iVar2;
  OpenCLKernels *this_00;
  double dVar3;
  bool bVar4;
  UMat *pUVar5;
  _InputArray *p_Var6;
  UMat *src_2;
  reference pvVar7;
  string local_370;
  int local_350;
  byte local_34a;
  byte local_349;
  int i;
  bool ret_2;
  bool ret_1;
  UMat *old_similarity_levels;
  UMat *local_320;
  UMat *new_similarity_levels;
  UMat *prev_frame;
  UMat *pUStack_308;
  bool ret;
  UMat *old_adjacent_similarity;
  UMat *local_2e0;
  UMat *new_adjacent_similarity;
  UMat *last_frame;
  _InputArray local_2b8;
  _InputArray local_2a0;
  _OutputArray local_288;
  UMat *local_270;
  UMat *frame_copy;
  undefined1 local_260 [4];
  uint number_of_dropped;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *error_local;
  double timestamp_local;
  UMat *frame_local;
  FlickerRemover *this_local;
  
  local_30 = error;
  error_local = (string *)timestamp;
  timestamp_local = (double)frame;
  frame_local = (UMat *)this;
  if ((*(int *)(frame + 8) != this->frame_rows) || (*(int *)(frame + 0xc) != this->frame_cols)) {
    std::__cxx11::to_string(&local_150,*(int *)(frame + 0xc));
    std::operator+(&local_130,"Flickering cannot be removed. Size of the frame: ",&local_150);
    std::operator+(&local_110,&local_130,"x");
    std::__cxx11::to_string(&local_180,*(int *)((long)timestamp_local + 8));
    std::operator+(&local_f0,&local_110,&local_180);
    std::operator+(&local_d0,&local_f0," is different than expected: ");
    std::__cxx11::to_string(&local_1a0,this->frame_cols);
    std::operator+(&local_b0,&local_d0,&local_1a0);
    std::operator+(&local_90,&local_b0,"x");
    std::__cxx11::to_string(&local_1c0,this->frame_rows);
    std::operator+(&local_70,&local_90,&local_1c0);
    std::operator+(&local_50,&local_70,".");
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    return (UMat *)0x0;
  }
  bVar4 = timestampIsCloseToExpectedTimestamp(this,timestamp);
  if (!bVar4) {
    if ((double)error_local < this->expected_timestamp) {
      std::__cxx11::to_string(&local_240,(double)error_local);
      std::operator+(&local_220,"Received unexpected timestamp: ",&local_240);
      std::operator+(&local_200,&local_220," Expected value close to: ");
      std::__cxx11::to_string((string *)local_260,this->expected_timestamp);
      std::operator+(&local_1e0,&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260)
      ;
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)local_260);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      return (UMat *)0x0;
    }
    frame_copy._4_4_ =
         (int)(long)((((double)error_local - this->expected_timestamp) +
                     this->accepted_timestamp_difference) / this->timestamps_delta);
    this->actual_mask = (this->actual_mask + frame_copy._4_4_) % (this->number_of_masks + 1);
    this->expected_timestamp = (double)error_local;
  }
  calculateNextExpectedTimestamp(this,(double)error_local);
  pUVar5 = (UMat *)operator_new(0x50);
  cv::UMat::UMat(pUVar5,this->frame_rows,this->frame_cols,0);
  dVar3 = timestamp_local;
  local_270 = pUVar5;
  if (this->actual_mask == this->number_of_masks) {
    this->actual_mask = 0;
    cv::_OutputArray::_OutputArray(&local_288,pUVar5);
    cv::UMat::convertTo((_OutputArray *)dVar3,(int)&local_288,1.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_288);
  }
  else {
    cv::_InputArray::_InputArray(&local_2a0,(UMat *)timestamp_local);
    pvVar7 = std::vector<cv::UMat,_std::allocator<cv::UMat>_>::operator[]
                       (&this->masks,(ulong)this->actual_mask);
    cv::_InputArray::_InputArray(&local_2b8,pvVar7);
    cv::_OutputArray::_OutputArray((_OutputArray *)&last_frame,local_270);
    p_Var6 = (_InputArray *)cv::noArray();
    cv::subtract(&local_2a0,&local_2b8,(_OutputArray *)&last_frame,p_Var6,0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&last_frame);
    cv::_InputArray::~_InputArray(&local_2b8);
    cv::_InputArray::~_InputArray(&local_2a0);
    this->actual_mask = this->actual_mask + 1;
  }
  new_adjacent_similarity = CircularBuffer<cv::UMat_*>::last(&this->frames_block);
  if (new_adjacent_similarity != (UMat *)0x0) {
    pUVar5 = (UMat *)operator_new(0x50);
    iVar1 = this->frame_rows;
    iVar2 = this->frame_cols;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&old_adjacent_similarity,0.0);
    cv::UMat::UMat(pUVar5,iVar1,iVar2,0,&old_adjacent_similarity);
    local_2e0 = pUVar5;
    pUStack_308 = CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar5);
    prev_frame._7_1_ =
         OpenCLKernels::runKernelUpdateSimilarityLevels
                   (this->opencl_kernels,new_adjacent_similarity,local_270,pUStack_308,
                    this->flickering_threshold,local_2e0,&this->adjacent_frames_similarity_sum,
                    local_30);
    pUVar5 = pUStack_308;
    if (pUStack_308 != (UMat *)0x0) {
      cv::UMat::~UMat(pUStack_308);
      operator_delete(pUVar5,0x50);
    }
    pUVar5 = local_270;
    if ((prev_frame._7_1_ & 1) == 0) {
      if (local_270 != (UMat *)0x0) {
        cv::UMat::~UMat(local_270);
        operator_delete(pUVar5,0x50);
      }
      return (UMat *)0x0;
    }
  }
  new_similarity_levels = CircularBuffer<cv::UMat_*>::push(&this->frames_block,local_270);
  if (new_similarity_levels != (UMat *)0x0) {
    pUVar5 = (UMat *)operator_new(0x50);
    iVar1 = this->frame_rows;
    iVar2 = this->frame_cols;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&old_similarity_levels,0.0);
    cv::UMat::UMat(pUVar5,iVar1,iVar2,0,&old_similarity_levels);
    local_320 = pUVar5;
    _i = CircularBuffer<cv::UMat_*>::push(&this->corresponding_frames_similarity_levels,pUVar5);
    local_349 = OpenCLKernels::runKernelUpdateSimilarityLevels
                          (this->opencl_kernels,new_similarity_levels,local_270,_i,
                           this->flickering_threshold,local_320,
                           &this->corresponding_frames_similarity_sum,local_30);
    pUVar5 = _i;
    if (_i != (UMat *)0x0) {
      cv::UMat::~UMat(_i);
      operator_delete(pUVar5,0x50);
    }
    if ((local_349 & 1) == 0) {
      return (UMat *)0x0;
    }
  }
  if ((this->actual_mask == this->number_of_masks) &&
     (bVar4 = CircularBuffer<cv::UMat_*>::isFull(&this->frames_block), bVar4)) {
    local_34a = OpenCLKernels::runKernelUpdateFlickerCounter
                          (this->opencl_kernels,&this->adjacent_frames_similarity_sum,
                           this->number_of_masks,&this->corresponding_frames_similarity_sum,
                           (float)this->block_size * 0.7,&this->flicker_counter,local_30);
    if (!(bool)local_34a) {
      return (UMat *)0x0;
    }
    for (local_350 = 0; local_350 < (int)this->number_of_masks; local_350 = local_350 + 1) {
      this_00 = this->opencl_kernels;
      pUVar5 = CircularBuffer<cv::UMat_*>::operator[](&this->frames_block,0);
      src_2 = CircularBuffer<cv::UMat_*>::operator[](&this->frames_block,local_350 + 1);
      iVar1 = this->max_allowed_flicker_duration;
      pvVar7 = std::vector<cv::UMat,_std::allocator<cv::UMat>_>::operator[]
                         (&this->masks,(long)local_350);
      std::__cxx11::string::string((string *)&local_370,(string *)local_30);
      local_34a = OpenCLKernels::runKernelUpdateMasks
                            (this_00,pUVar5,src_2,&this->flicker_counter,iVar1,pvVar7,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      if ((local_34a & 1) == 0) {
        return (UMat *)0x0;
      }
    }
    bVar4 = OpenCLKernels::runKernelZeroFlickerCounter
                      (this->opencl_kernels,this->max_allowed_flicker_duration,
                       &this->flicker_counter,local_30);
    if (!bVar4) {
      return (UMat *)0x0;
    }
  }
  return local_270;
}

Assistant:

UMat *FlickerRemover::removeFlickering(const UMat &frame, double timestamp, string &error)
{
    if(frame.rows != frame_rows || frame.cols != frame_cols) {
        error = "Flickering cannot be removed. Size of the frame: " + to_string(frame.cols) + "x" +
                to_string(frame.rows) + " is different than expected: " + to_string(frame_cols) + "x" +
                to_string(frame_rows) + ".";
        return nullptr;
    }
    if(!timestampIsCloseToExpectedTimestamp(timestamp)) {
        //very unlikely. Should not happen...
        if(timestamp < expected_timestamp) {
            error = "Received unexpected timestamp: " + to_string(timestamp) + " Expected value close to: " +
                    to_string(expected_timestamp);
            return nullptr;
        }
        //calculate number of frames that were dropped
        auto number_of_dropped = (unsigned int) ((timestamp - expected_timestamp + accepted_timestamp_difference) /
                                                 timestamps_delta);
        actual_mask = (actual_mask + number_of_dropped) % (number_of_masks + 1);
        expected_timestamp = timestamp;
    }
    calculateNextExpectedTimestamp(timestamp);

    auto frame_copy = new UMat(frame_rows, frame_cols, CV_8UC1);

    if(actual_mask == number_of_masks) {
        actual_mask = 0;
        frame.convertTo(*frame_copy, CV_8UC1);
    } else {
        subtract(frame, masks[actual_mask], *frame_copy, noArray(), CV_8UC1);
        actual_mask++;
    }

    auto last_frame = frames_block.last();
    if(last_frame != nullptr) {
        auto new_adjacent_similarity = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_adjacent_similarity = adjacent_frames_similarity_levels.push(new_adjacent_similarity);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*last_frame, *frame_copy, *old_adjacent_similarity,
                                                                  flickering_threshold, *new_adjacent_similarity,
                                                                  adjacent_frames_similarity_sum, error);
        delete old_adjacent_similarity;
        if(!ret) {
            delete frame_copy;
            return nullptr;
        }
    }

    //push returns pointer to the allocated earlier matrix, but do not delete, since we already returned this pointer
    //outside of this method, and it is the responsibility of the caller to delete this pointer.
    auto prev_frame = frames_block.push(frame_copy);

    if(prev_frame != nullptr) {
        auto new_similarity_levels = new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0));
        auto old_similarity_levels = corresponding_frames_similarity_levels.push(new_similarity_levels);

        auto ret = opencl_kernels.runKernelUpdateSimilarityLevels(*prev_frame, *frame_copy, *old_similarity_levels,
                                                                  flickering_threshold, *new_similarity_levels,
                                                                  corresponding_frames_similarity_sum, error);
        delete old_similarity_levels;
        if(!ret) {
            return nullptr;
        }
    }

    if(actual_mask == number_of_masks && frames_block.isFull()) {
        auto ret = opencl_kernels.runKernelUpdateFlickerCounter(adjacent_frames_similarity_sum, number_of_masks,
                                                                corresponding_frames_similarity_sum,
                                                                0.7f * (float) block_size, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
        for(int i = 0; i < (int) number_of_masks; i++) {
            ret = opencl_kernels.runKernelUpdateMasks(*(frames_block[0]), *(frames_block[i + 1]), flicker_counter,
                                                      max_allowed_flicker_duration, masks[i], error);
            if(!ret) {
                return nullptr;
            }
        }
        ret = opencl_kernels.runKernelZeroFlickerCounter(max_allowed_flicker_duration, flicker_counter, error);
        if(!ret) {
            return nullptr;
        }
    }
    return frame_copy;
}